

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP3Writer::AggregateWriteData(BP3Writer *this,bool isFinal,int transportIndex)

{
  byte resetAbsolutePosition;
  int iVar1;
  byte in_SIL;
  Buffer *in_RDI;
  BPBase *unaff_retaddr;
  int in_stack_0000000c;
  TransportMan *in_stack_00000010;
  char *in_stack_00000018;
  TransportMan *in_stack_00000020;
  BufferSTL *bufferSTL_1;
  Buffer *bufferSTL;
  ExchangeAbsolutePositionRequests absolutePositionRequests;
  ExchangeRequests dataRequests;
  int r;
  ScopedTimer __var2389;
  int in_stack_000000b4;
  ExchangeRequests *in_stack_000000b8;
  MPIChain *in_stack_000000c0;
  bool in_stack_000000ff;
  BufferSTL *in_stack_00000100;
  Comm *in_stack_00000108;
  BP3Serializer *in_stack_00000110;
  int in_stack_00000154;
  ExchangeAbsolutePositionRequests *in_stack_00000158;
  MPIChain *in_stack_00000160;
  int in_stack_0000017c;
  Buffer *in_stack_00000180;
  MPIChain *in_stack_00000188;
  int in_stack_0000025c;
  Buffer *in_stack_00000260;
  MPIChain *in_stack_00000268;
  Buffer *in_stack_ffffffffffffff68;
  MPIChain *in_stack_ffffffffffffff70;
  BPSerializer *in_stack_ffffffffffffffa0;
  int local_2c;
  undefined1 in_stack_fffffffffffffff6;
  Buffer *buffer;
  
  resetAbsolutePosition = in_SIL & 1;
  buffer = in_RDI;
  if (AggregateWriteData(bool,int)::__var389 == '\0') {
    iVar1 = __cxa_guard_acquire(&AggregateWriteData(bool,int)::__var389);
    if (iVar1 != 0) {
      AggregateWriteData::__var389 = (void *)ps_timer_create_("BP3Writer::AggregateWriteData");
      __cxa_guard_release(&AggregateWriteData(bool,int)::__var389);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  adios2::format::BP3Serializer::CloseStream
            ((BP3Serializer *)
             absolutePositionRequests.m_Send.m_Impl._M_t.
             super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
             .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl,
             (IO *)bufferSTL,bufferSTL_1._7_1_);
  for (local_2c = 0;
      local_2c < *(int *)(in_RDI[3]._vptr_Buffer[-3] + 0x1c + (long)&in_RDI[0xf].m_Type._M_dataplus)
      ; local_2c = local_2c + 1) {
    aggregator::MPIChain::IExchange(in_stack_00000268,in_stack_00000260,in_stack_0000025c);
    aggregator::MPIChain::IExchangeAbsolutePosition
              (in_stack_00000188,in_stack_00000180,in_stack_0000017c);
    if ((*(byte *)((long)&in_RDI[0xf].m_FixedSize + (long)in_RDI[3]._vptr_Buffer[-3]) & 1) != 0) {
      in_stack_ffffffffffffffa0 =
           (BPSerializer *)
           aggregator::MPIChain::GetConsumerBuffer
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      (*in_stack_ffffffffffffffa0->_vptr_BPSerializer[3])();
      transportman::TransportMan::WriteFiles
                (in_stack_00000020,in_stack_00000018,(size_t)in_stack_00000010,in_stack_0000000c);
      transportman::TransportMan::FlushFiles(in_stack_00000010,in_stack_0000000c);
    }
    aggregator::MPIChain::WaitAbsolutePosition
              (in_stack_00000160,in_stack_00000158,in_stack_00000154);
    aggregator::MPIChain::Wait(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
    aggregator::MPIChain::SwapBuffers
              ((MPIChain *)
               ((long)&in_RDI[0xe].m_AbsolutePosition + (long)in_RDI[3]._vptr_Buffer[-3]),local_2c);
    aggregator::MPIChain::ExchangeAbsolutePositionRequests::~ExchangeAbsolutePositionRequests
              ((ExchangeAbsolutePositionRequests *)in_stack_ffffffffffffff70);
    aggregator::MPIChain::ExchangeRequests::~ExchangeRequests
              ((ExchangeRequests *)in_stack_ffffffffffffff70);
  }
  adios2::format::BPSerializer::UpdateOffsetsInMetadata(in_stack_ffffffffffffffa0);
  if ((resetAbsolutePosition & 1) != 0) {
    adios2::format::BPBase::ResetBuffer
              (unaff_retaddr,buffer,(bool)resetAbsolutePosition,(bool)in_stack_fffffffffffffff6);
    adios2::format::BP3Serializer::AggregateCollectiveMetadata
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000ff);
    if ((*(byte *)((long)&in_RDI[0xf].m_FixedSize + (long)in_RDI[3]._vptr_Buffer[-3]) & 1) != 0) {
      in_stack_ffffffffffffff70 = (MPIChain *)((long)&in_RDI[0x16].m_Type.field_2 + 8);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa0105b);
      transportman::TransportMan::WriteFiles
                (in_stack_00000020,in_stack_00000018,(size_t)in_stack_00000010,in_stack_0000000c);
      transportman::TransportMan::FlushFiles(in_stack_00000010,in_stack_0000000c);
    }
    aggregator::MPIChain::Close((MPIChain *)0xa010b3);
  }
  aggregator::MPIChain::ResetBuffers
            ((MPIChain *)((long)&in_RDI[0xe].m_AbsolutePosition + (long)in_RDI[3]._vptr_Buffer[-3]))
  ;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void BP3Writer::AggregateWriteData(const bool isFinal, const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::AggregateWriteData");
    m_BP3Serializer.CloseStream(m_IO, false);

    // async?
    for (int r = 0; r < m_BP3Serializer.m_Aggregator.m_Size; ++r)
    {
        aggregator::MPIChain::ExchangeRequests dataRequests =
            m_BP3Serializer.m_Aggregator.IExchange(m_BP3Serializer.m_Data, r);

        aggregator::MPIChain::ExchangeAbsolutePositionRequests absolutePositionRequests =
            m_BP3Serializer.m_Aggregator.IExchangeAbsolutePosition(m_BP3Serializer.m_Data, r);

        if (m_BP3Serializer.m_Aggregator.m_IsAggregator)
        {
            const format::Buffer &bufferSTL =
                m_BP3Serializer.m_Aggregator.GetConsumerBuffer(m_BP3Serializer.m_Data);

            m_FileDataManager.WriteFiles(bufferSTL.Data(), bufferSTL.m_Position, transportIndex);

            m_FileDataManager.FlushFiles(transportIndex);
        }

        m_BP3Serializer.m_Aggregator.WaitAbsolutePosition(absolutePositionRequests, r);

        m_BP3Serializer.m_Aggregator.Wait(dataRequests, r);
        m_BP3Serializer.m_Aggregator.SwapBuffers(r);
    }

    m_BP3Serializer.UpdateOffsetsInMetadata();

    if (isFinal) // Write metadata footer
    {
        format::BufferSTL &bufferSTL = m_BP3Serializer.m_Data;
        m_BP3Serializer.ResetBuffer(bufferSTL, false, false);

        m_BP3Serializer.AggregateCollectiveMetadata(m_BP3Serializer.m_Aggregator.m_Comm, bufferSTL,
                                                    false);

        if (m_BP3Serializer.m_Aggregator.m_IsAggregator)
        {
            m_FileDataManager.WriteFiles(bufferSTL.m_Buffer.data(), bufferSTL.m_Position,
                                         transportIndex);

            m_FileDataManager.FlushFiles(transportIndex);
        }

        m_BP3Serializer.m_Aggregator.Close();
    }

    m_BP3Serializer.m_Aggregator.ResetBuffers();
}